

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O0

string * __thiscall
license::get_file_contents_abi_cxx11_
          (string *__return_storage_ptr__,license *this,char *filename,size_t max_size)

{
  bool bVar1;
  long lVar2;
  runtime_error *this_00;
  int *piVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  size_t limited_size;
  undefined8 local_250;
  unsigned_long local_248;
  size_t index;
  long local_230;
  ifstream in;
  char *local_20;
  size_t max_size_local;
  char *filename_local;
  string *contents;
  
  local_20 = filename;
  max_size_local = (size_t)this;
  filename_local = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::ifstream::ifstream(&local_230,(char *)max_size_local,_S_bin);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
  if (bVar1) {
    std::istream::seekg((long)&local_230,_S_beg);
    auVar5 = std::istream::tellg();
    local_250 = auVar5._8_8_;
    limited_size = auVar5._0_8_;
    local_248 = std::fpos::operator_cast_to_long((fpos *)&limited_size);
    std::min<unsigned_long>(&local_248,(unsigned_long *)&local_20);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    std::istream::seekg((long)&local_230,_S_beg);
    lVar2 = std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    std::istream::read((char *)&local_230,lVar2);
    std::ifstream::close();
    std::ifstream::~ifstream(&local_230);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  std::runtime_error::runtime_error(this_00,pcVar4);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

string get_file_contents(const char *filename, size_t max_size) {
	string contents;
	ifstream in(filename, std::ios::binary);
	if (in) {
		size_t index = (size_t)in.seekg(0, ios::end).tellg();
		size_t limited_size = min(index, max_size);
		contents.resize(limited_size);
		in.seekg(0, ios::beg);
		in.read(&contents[0], limited_size);
		in.close();
	} else {
		throw runtime_error(std::strerror(errno));
	}
	return contents;
}